

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void init_test_get(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                  context *ctx)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong local_48;
  unsigned_long_long n_key;
  undefined4 local_38;
  int cache_is_full;
  
  lVar3 = CONCAT44(in_register_0000000c,ops_per_thread);
  cache_is_full = n_threads;
  free_cache(cache);
  n_key._4_4_ = 0;
  vmemcache_callback_on_evict(cache,on_evict_cb);
  uVar5 = 0;
  printf("%s: filling the pool...","init_test_get");
  fflush(_stdout);
  local_38 = SUB84(threads,0);
  for (uVar6 = 0; (n_key._4_4_ == 0 && (uVar6 < ((ulong)threads & 0xffffffff))); uVar6 = uVar6 + 1)
  {
    lVar4 = ((uVar6 & 0xffffffff) % (ulong)*(uint *)(lVar3 + 0x18)) * 0x10;
    local_48 = uVar6;
    iVar1 = vmemcache_put(cache,&local_48,8,*(undefined8 *)(*(long *)(lVar3 + 0x10) + 8 + lVar4),
                          *(undefined8 *)(*(long *)(lVar3 + 0x10) + lVar4));
    if (iVar1 != 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
              ,0xdf,"init_test_get");
      __stream = _stderr;
      uVar2 = vmemcache_errormsg();
      fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
      fputc(10,_stderr);
      abort();
    }
    uVar5 = uVar5 + cache_is_full;
  }
  printf(" done (inserted %u elements)\n",uVar6 & 0xffffffff);
  vmemcache_callback_on_evict(cache,0,0);
  if (uVar6 < ((ulong)threads & 0xffffffff)) {
    printf("%s: decreasing ops_count to: %u\n","init_test_get",(ulong)uVar5);
    local_38 = (int)uVar6;
  }
  for (lVar4 = 0; (ulong)(uint)cache_is_full * 0x28 - lVar4 != 0; lVar4 = lVar4 + 0x28) {
    *(code **)(lVar3 + 0x20 + lVar4) = worker_thread_get;
    *(undefined4 *)(lVar3 + 0x1c + lVar4) = local_38;
  }
  return;
}

Assistant:

static void
init_test_get(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx)
{
	free_cache(cache);

	int cache_is_full = 0;
	vmemcache_callback_on_evict(cache, on_evict_cb, &cache_is_full);

	printf("%s: filling the pool...", __func__);
	fflush(stdout);

	unsigned n = 0; /* number of elements put into the cache */
	while (!cache_is_full && n < ops_per_thread) {
		unsigned long long n_key = n;
		if (vmemcache_put(cache, &n_key, sizeof(n_key),
					ctx->buffs[n % ctx->nbuffs].buff,
					ctx->buffs[n % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
		n++;
	}

	printf(" done (inserted %u elements)\n", n);

	vmemcache_callback_on_evict(cache, NULL, NULL);

	if (ops_per_thread > n) {
		/* we cannot get more than we have put */
		ops_per_thread = n;
		printf("%s: decreasing ops_count to: %u\n",
			__func__, n_threads * ops_per_thread);
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_get;
		ctx[i].ops_count = ops_per_thread;
	}
}